

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j,short *data,stbi__huffman *hdc,int b)

{
  stbi__uint32 sVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  char *pcVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  long *in_FS_OFFSET;
  bool bVar12;
  bool bVar13;
  int iVar11;
  
  if (j->spec_end == 0) {
    if (j->code_bits < 0x10) {
      stbi__grow_buffer_unsafe(j);
    }
    if (j->succ_high != 0) {
      if (j->code_bits < 1) {
        stbi__grow_buffer_unsafe(j);
      }
      if (j->code_bits < 1) {
        return 1;
      }
      sVar1 = j->code_buffer;
      j->code_buffer = sVar1 * 2;
      j->code_bits = j->code_bits + -1;
      if (-1 < (int)sVar1) {
        return 1;
      }
      *data = *data + (short)(1 << ((byte)j->succ_low & 0x1f));
      return 1;
    }
    data[0x38] = 0;
    data[0x39] = 0;
    data[0x3a] = 0;
    data[0x3b] = 0;
    data[0x3c] = 0;
    data[0x3d] = 0;
    data[0x3e] = 0;
    data[0x3f] = 0;
    data[0x30] = 0;
    data[0x31] = 0;
    data[0x32] = 0;
    data[0x33] = 0;
    data[0x34] = 0;
    data[0x35] = 0;
    data[0x36] = 0;
    data[0x37] = 0;
    data[0x28] = 0;
    data[0x29] = 0;
    data[0x2a] = 0;
    data[0x2b] = 0;
    data[0x2c] = 0;
    data[0x2d] = 0;
    data[0x2e] = 0;
    data[0x2f] = 0;
    data[0x20] = 0;
    data[0x21] = 0;
    data[0x22] = 0;
    data[0x23] = 0;
    data[0x24] = 0;
    data[0x25] = 0;
    data[0x26] = 0;
    data[0x27] = 0;
    data[0x18] = 0;
    data[0x19] = 0;
    data[0x1a] = 0;
    data[0x1b] = 0;
    data[0x1c] = 0;
    data[0x1d] = 0;
    data[0x1e] = 0;
    data[0x1f] = 0;
    data[0x10] = 0;
    data[0x11] = 0;
    data[0x12] = 0;
    data[0x13] = 0;
    data[0x14] = 0;
    data[0x15] = 0;
    data[0x16] = 0;
    data[0x17] = 0;
    data[8] = 0;
    data[9] = 0;
    data[10] = 0;
    data[0xb] = 0;
    data[0xc] = 0;
    data[0xd] = 0;
    data[0xe] = 0;
    data[0xf] = 0;
    data[0] = 0;
    data[1] = 0;
    data[2] = 0;
    data[3] = 0;
    data[4] = 0;
    data[5] = 0;
    data[6] = 0;
    data[7] = 0;
    if (j->code_bits < 0x10) {
      stbi__grow_buffer_unsafe(j);
    }
    uVar10 = j->code_buffer;
    uVar3 = (ulong)hdc->fast[uVar10 >> 0x17];
    if (uVar3 == 0xff) {
      lVar8 = 0;
      do {
        lVar7 = lVar8;
        lVar8 = lVar7 + 1;
      } while (hdc->maxcode[lVar7 + 10] <= uVar10 >> 0x10);
      iVar11 = j->code_bits;
      if (lVar8 == 8) {
        j->code_bits = iVar11 + -0x10;
        uVar6 = 0xffffffff;
      }
      else {
        uVar6 = 0xffffffff;
        if (((int)(lVar7 + 10) <= iVar11) &&
           (uVar9 = (uVar10 >> (0x17U - (char)lVar8 & 0x1f) & stbi__bmask[lVar7 + 10]) +
                    hdc->delta[lVar7 + 10], uVar9 < 0x100)) {
          j->code_bits = (iVar11 - (int)lVar8) + -9;
          j->code_buffer = uVar10 << ((byte)(lVar7 + 10) & 0x1f);
          uVar3 = (ulong)uVar9;
          goto LAB_00166261;
        }
      }
    }
    else {
      bVar4 = hdc->size[uVar3];
      uVar6 = 0xffffffff;
      if ((int)(uint)bVar4 <= j->code_bits) {
        j->code_buffer = uVar10 << (bVar4 & 0x1f);
        j->code_bits = j->code_bits - (uint)bVar4;
LAB_00166261:
        uVar6 = (uint)hdc->values[uVar3];
      }
    }
    if (uVar6 < 0x10) {
      uVar10 = 0;
      if (uVar6 != 0) {
        if (j->code_bits < (int)uVar6) {
          stbi__grow_buffer_unsafe(j);
        }
        uVar10 = 0;
        if ((int)uVar6 <= j->code_bits) {
          uVar10 = j->code_buffer;
          bVar4 = (byte)uVar6 & 0x1f;
          uVar2 = uVar10 << bVar4 | uVar10 >> 0x20 - bVar4;
          uVar9 = stbi__bmask[uVar6];
          j->code_buffer = ~uVar9 & uVar2;
          j->code_bits = j->code_bits - uVar6;
          iVar11 = 0;
          if (-1 < (int)uVar10) {
            iVar11 = stbi__jbias[uVar6];
          }
          uVar10 = iVar11 + (uVar2 & uVar9);
        }
      }
      uVar6 = j->img_comp[b].dc_pred;
      if (-1 < (int)(uVar6 ^ uVar10)) {
        bVar12 = (int)uVar6 <= (int)(uVar10 ^ 0x7fffffff);
        if ((int)(uVar6 & uVar10) < 0) {
          bVar12 = (int)(-0x80000000 - uVar10) <= (int)uVar6;
        }
        if (!bVar12) {
          lVar8 = *in_FS_OFFSET;
          pcVar5 = "bad delta";
          goto LAB_00166158;
        }
      }
      uVar6 = uVar6 + uVar10;
      j->img_comp[b].dc_pred = uVar6;
      bVar4 = (byte)j->succ_low;
      uVar10 = 1 << (bVar4 & 0x1f);
      if ((int)(uVar10 ^ uVar6) < 0) {
        if (j->succ_low == 0x1f) {
          bVar13 = false;
          bVar12 = uVar6 == 0;
          uVar9 = uVar6;
        }
        else {
          uVar10 = -0x8000 / (int)uVar10;
          bVar13 = SBORROW4(uVar10,uVar6);
          uVar9 = uVar10 - uVar6;
          bVar12 = uVar10 == uVar6;
        }
        bVar12 = bVar12 || bVar13 != (int)uVar9 < 0;
      }
      else {
        bVar12 = (int)uVar6 <= (int)(0x7fffU >> (bVar4 & 0x1f));
      }
      if (bVar12) {
        *data = (short)(uVar6 << (bVar4 & 0x1f));
        return 1;
      }
    }
  }
  lVar8 = *in_FS_OFFSET;
  pcVar5 = "can\'t merge dc and ac";
LAB_00166158:
  *(char **)(lVar8 + -0x20) = pcVar5;
  return 0;
}

Assistant:

static int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j, short data[64], stbi__huffman *hdc, int b)
{
   int diff,dc;
   int t;
   if (j->spec_end != 0) return stbi__err("can't merge dc and ac", "Corrupt JPEG");

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);

   if (j->succ_high == 0) {
      // first scan for DC coefficient, must be first
      memset(data,0,64*sizeof(data[0])); // 0 all the ac values now
      t = stbi__jpeg_huff_decode(j, hdc);
      if (t < 0 || t > 15) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      diff = t ? stbi__extend_receive(j, t) : 0;

      if (!stbi__addints_valid(j->img_comp[b].dc_pred, diff)) return stbi__err("bad delta", "Corrupt JPEG");
      dc = j->img_comp[b].dc_pred + diff;
      j->img_comp[b].dc_pred = dc;
      if (!stbi__mul2shorts_valid(dc, 1 << j->succ_low)) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      data[0] = (short) (dc * (1 << j->succ_low));
   } else {
      // refinement scan for DC coefficient
      if (stbi__jpeg_get_bit(j))
         data[0] += (short) (1 << j->succ_low);
   }
   return 1;
}